

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O2

ostream * tcu::operator<<(ostream *stream,RGBA c)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,"RGBA(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c.m_value & 0xff);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c.m_value >> 8 & 0xff);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c.m_value >> 0x10 & 0xff);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,c.m_value >> 0x18);
  poVar1 = std::operator<<(poVar1,")");
  return poVar1;
}

Assistant:

inline std::ostream& operator<< (std::ostream& stream, RGBA c)
{
	return stream << "RGBA(" << c.getRed() << ", " << c.getGreen() << ", " << c.getBlue() << ", " << c.getAlpha() << ")";
}